

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs,
          char *filename)

{
  bool bVar1;
  ulong uVar2;
  pointer value_00;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  string value;
  string efp;
  cmExpandedCommandArgument local_58;
  
  GetExecutionFilePath_abi_cxx11_(&efp,this);
  if (filename == (char *)0x0) {
    filename = (char *)efp._M_dataplus;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,((long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  value_00 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_start;
  do {
    if (value_00 ==
        (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&efp);
      return !bVar1;
    }
    if (value_00->Delim == Bracket) {
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&value_00->Value,true);
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
      emplace_back<cmExpandedCommandArgument>(outArgs,&local_58);
LAB_00345cb0:
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString(this,&value,false,false,false,filename,value_00->Line,false,false);
      if (value_00->Delim == Quoted) {
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&value,true);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        emplace_back<cmExpandedCommandArgument>(outArgs,&local_58);
        goto LAB_00345cb0;
      }
      stringArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      stringArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      stringArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&value,&stringArgs,false);
      lVar3 = 0;
      for (uVar2 = 0;
          uVar2 < (ulong)((long)stringArgs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)stringArgs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1)
      {
        cmExpandedCommandArgument::cmExpandedCommandArgument
                  (&local_58,
                   (string *)
                   ((long)&((stringArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
                   false);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        emplace_back<cmExpandedCommandArgument>(outArgs,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        lVar3 = lVar3 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&stringArgs);
    }
    value_00 = value_00 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename)
    {
    filename = efp.c_str();
    }
  std::vector<cmListFileArgument>::const_iterator i;
  std::string value;
  outArgs.reserve(inArgs.size());
  for(i = inArgs.begin(); i != inArgs.end(); ++i)
    {
    // No expansion in a bracket argument.
    if(i->Delim == cmListFileArgument::Bracket)
      {
      outArgs.push_back(cmExpandedCommandArgument(i->Value, true));
      continue;
      }
    // Expand the variables in the argument.
    value = i->Value;
    this->ExpandVariablesInString(value, false, false, false,
                                  filename, i->Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if(i->Delim == cmListFileArgument::Quoted)
      {
      outArgs.push_back(cmExpandedCommandArgument(value, true));
      }
    else
      {
      std::vector<std::string> stringArgs;
      cmSystemTools::ExpandListArgument(value, stringArgs);
      for(size_t j = 0; j < stringArgs.size(); ++j)
        {
        outArgs.push_back(cmExpandedCommandArgument(stringArgs[j], false));
        }
      }
    }
  return !cmSystemTools::GetFatalErrorOccured();
}